

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int PKCS8_marshal_encrypted_private_key
              (CBB *out,int pbe_nid,EVP_CIPHER *cipher,char *pass,size_t pass_len,uint8_t *salt,
              size_t salt_len,int iterations,EVP_PKEY *pkey)

{
  undefined8 uVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  evp_cipher_ctx_st *ctx_00;
  EVP_CIPHER_CTX *pEVar5;
  int local_198;
  int local_194;
  int n2;
  int n1;
  uint8_t *ptr;
  CBB ciphertext;
  size_t max_out;
  CBB epki;
  CBB plaintext_cbb;
  ScopedEVP_CIPHER_CTX ctx;
  size_t plaintext_len;
  uint8_t *salt_buf;
  uint8_t *plaintext;
  uint8_t *puStack_38;
  int ret;
  uint8_t *salt_local;
  size_t pass_len_local;
  char *pass_local;
  EVP_CIPHER *cipher_local;
  CBB *pCStack_10;
  int pbe_nid_local;
  CBB *out_local;
  
  plaintext._4_4_ = 0;
  salt_buf = (uint8_t *)0x0;
  plaintext_len = 0;
  ctx.ctx_.poisoned = 0;
  ctx.ctx_._148_4_ = 0;
  puStack_38 = salt;
  salt_local = (uint8_t *)pass_len;
  pass_len_local = (size_t)pass;
  pass_local = (char *)cipher;
  cipher_local._4_4_ = pbe_nid;
  pCStack_10 = out;
  bssl::internal::
  StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                  *)((long)&plaintext_cbb.u + 0x18));
  puVar2 = puStack_38;
  if (puStack_38 == (uchar *)0x0) {
    if (salt_len == 0) {
      salt_len = 8;
    }
    plaintext_len = (size_t)OPENSSL_malloc(salt_len);
    if (((uchar *)plaintext_len == (uchar *)0x0) ||
       (iVar3 = RAND_bytes((uchar *)plaintext_len,(int)salt_len), puVar2 = (uchar *)plaintext_len,
       iVar3 == 0)) goto LAB_002dafad;
  }
  puStack_38 = puVar2;
  if (iterations < 1) {
    iterations = 0x800;
  }
  iVar3 = CBB_init((CBB *)((long)&epki.u + 0x18),0x80);
  if (((iVar3 == 0) ||
      (iVar3 = EVP_marshal_private_key((CBB *)((long)&epki.u + 0x18),pkey), iVar3 == 0)) ||
     (iVar3 = CBB_finish((CBB *)((long)&epki.u + 0x18),&salt_buf,(size_t *)&ctx.ctx_.poisoned),
     iVar3 == 0)) {
    CBB_cleanup((CBB *)((long)&epki.u + 0x18));
  }
  else {
    iVar3 = CBB_add_asn1(pCStack_10,(CBB *)&max_out,0x20000010);
    if (iVar3 != 0) {
      ctx_00 = bssl::internal::
               StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
               ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                      *)((long)&plaintext_cbb.u + 0x18));
      iVar3 = pkcs12_pbe_encrypt_init
                        ((CBB *)&max_out,ctx_00,cipher_local._4_4_,(EVP_CIPHER *)pass_local,
                         iterations,(char *)pass_len_local,(size_t)salt_local,puStack_38,salt_len);
      uVar1 = ctx.ctx_._144_8_;
      if (iVar3 != 0) {
        pEVar5 = (EVP_CIPHER_CTX *)
                 bssl::internal::
                 StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                 ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                        *)((long)&plaintext_cbb.u + 0x18));
        uVar4 = EVP_CIPHER_CTX_block_size(pEVar5);
        ciphertext.u._24_8_ = uVar1 + (ulong)uVar4;
        if ((ulong)ciphertext.u._24_8_ < (ulong)ctx.ctx_._144_8_) {
          ERR_put_error(0x13,0,0x76,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                        ,0x1c1);
        }
        else {
          iVar3 = CBB_add_asn1((CBB *)&max_out,(CBB *)&ptr,4);
          if ((iVar3 != 0) &&
             (iVar3 = CBB_reserve((CBB *)&ptr,(uint8_t **)&n2,ciphertext.u._24_8_), iVar3 != 0)) {
            pEVar5 = (EVP_CIPHER_CTX *)
                     bssl::internal::
                     StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                            *)((long)&plaintext_cbb.u + 0x18));
            iVar3 = EVP_CipherUpdate(pEVar5,_n2,&local_194,salt_buf,ctx.ctx_.poisoned);
            if (iVar3 != 0) {
              pEVar5 = (EVP_CIPHER_CTX *)
                       bssl::internal::
                       StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                       ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                              *)((long)&plaintext_cbb.u + 0x18));
              iVar3 = EVP_CipherFinal_ex(pEVar5,_n2 + local_194,&local_198);
              if (((iVar3 != 0) &&
                  (iVar3 = CBB_did_write((CBB *)&ptr,(long)(local_194 + local_198)), iVar3 != 0)) &&
                 (iVar3 = CBB_flush(pCStack_10), iVar3 != 0)) {
                plaintext._4_4_ = 1;
              }
            }
          }
        }
      }
    }
  }
LAB_002dafad:
  OPENSSL_free(salt_buf);
  OPENSSL_free((void *)plaintext_len);
  iVar3 = plaintext._4_4_;
  bssl::internal::
  StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                   *)((long)&plaintext_cbb.u + 0x18));
  return iVar3;
}

Assistant:

int PKCS8_marshal_encrypted_private_key(CBB *out, int pbe_nid,
                                        const EVP_CIPHER *cipher,
                                        const char *pass, size_t pass_len,
                                        const uint8_t *salt, size_t salt_len,
                                        int iterations, const EVP_PKEY *pkey) {
  int ret = 0;
  uint8_t *plaintext = NULL, *salt_buf = NULL;
  size_t plaintext_len = 0;
  bssl::ScopedEVP_CIPHER_CTX ctx;

  {
    // Generate a random salt if necessary.
    if (salt == NULL) {
      if (salt_len == 0) {
        salt_len = PKCS5_SALT_LEN;
      }

      salt_buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(salt_len));
      if (salt_buf == NULL || !RAND_bytes(salt_buf, salt_len)) {
        goto err;
      }

      salt = salt_buf;
    }

    if (iterations <= 0) {
      iterations = PKCS12_DEFAULT_ITER;
    }

    // Serialize the input key.
    CBB plaintext_cbb;
    if (!CBB_init(&plaintext_cbb, 128) ||
        !EVP_marshal_private_key(&plaintext_cbb, pkey) ||
        !CBB_finish(&plaintext_cbb, &plaintext, &plaintext_len)) {
      CBB_cleanup(&plaintext_cbb);
      goto err;
    }

    CBB epki;
    if (!CBB_add_asn1(out, &epki, CBS_ASN1_SEQUENCE) ||
        !pkcs12_pbe_encrypt_init(&epki, ctx.get(), pbe_nid, cipher,
                                 (uint32_t)iterations, pass, pass_len, salt,
                                 salt_len)) {
      goto err;
    }

    size_t max_out = plaintext_len + EVP_CIPHER_CTX_block_size(ctx.get());
    if (max_out < plaintext_len) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_TOO_LONG);
      goto err;
    }

    CBB ciphertext;
    uint8_t *ptr;
    int n1, n2;
    if (!CBB_add_asn1(&epki, &ciphertext, CBS_ASN1_OCTETSTRING) ||
        !CBB_reserve(&ciphertext, &ptr, max_out) ||
        !EVP_CipherUpdate(ctx.get(), ptr, &n1, plaintext, plaintext_len) ||
        !EVP_CipherFinal_ex(ctx.get(), ptr + n1, &n2) ||
        !CBB_did_write(&ciphertext, n1 + n2) || !CBB_flush(out)) {
      goto err;
    }

    ret = 1;
  }

err:
  OPENSSL_free(plaintext);
  OPENSSL_free(salt_buf);
  return ret;
}